

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ScriptFunctionType * __thiscall
Js::FunctionProxy::GetCrossSiteUndeferredFunctionType(FunctionProxy *this)

{
  BOOL BVar1;
  ParseableFunctionInfo *this_00;
  undefined8 local_20;
  FunctionProxy *this_local;
  
  BVar1 = HasParseableInfo(this);
  if (BVar1 == 0) {
    local_20 = (ScriptFunctionType *)0x0;
  }
  else {
    this_00 = GetParseableFunctionInfo(this);
    local_20 = ParseableFunctionInfo::GetCrossSiteUndeferredFunctionType(this_00);
  }
  return local_20;
}

Assistant:

ScriptFunctionType * FunctionProxy::GetCrossSiteUndeferredFunctionType() const
    {
        return HasParseableInfo() ? GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType() : nullptr;
    }